

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O1

void cnn::TensorTools::RandomBernoulli(Tensor *val,real p,real scale)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  float fVar7;
  double dVar8;
  
  uVar2 = (ulong)(val->d).nd;
  iVar4 = 1;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      iVar4 = iVar4 * (val->d).d[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  uVar5 = iVar4 * (val->d).bd;
  if (uVar5 != 0) {
    pfVar1 = val->v;
    lVar6 = 0;
    do {
      dVar8 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (rndeng);
      fVar7 = 1.0;
      if ((double)p <= dVar8) {
        fVar7 = 0.0;
      }
      *(float *)((long)pfVar1 + lVar6) = fVar7 * scale;
      lVar6 = lVar6 + 4;
    } while ((ulong)uVar5 << 2 != lVar6);
  }
  return;
}

Assistant:

void TensorTools::RandomBernoulli(Tensor& val, real p, real scale) {
  bernoulli_distribution distribution(p);
  auto b = [&] {return distribution(*rndeng) * scale;};
#if HAVE_CUDA
  float* t = new float[val.d.size()];
  generate(t, t + val.d.size(), b);
  CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
  delete[] t;
#else
  generate(val.v, val.v + val.d.size(), b);
#endif
}